

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChPhysicsItem.h
# Opt level: O2

void __thiscall
chrono::ChPhysicsItem::IntStateGetIncrement
          (ChPhysicsItem *this,uint off_x,ChState *x_new,ChState *x,uint off_v,ChStateDelta *Dv)

{
  double dVar1;
  double dVar2;
  int iVar3;
  CoeffReturnType pdVar4;
  Scalar *pSVar5;
  ulong index;
  long lVar6;
  
  lVar6 = 0;
  while( true ) {
    iVar3 = (**(code **)(*(long *)this + 0xb0))(this);
    if (iVar3 <= lVar6) break;
    index = (ulong)(off_x + (int)lVar6);
    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x_new,index);
    dVar1 = *pdVar4;
    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x,index);
    dVar2 = *pdVar4;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Dv,
                        (ulong)(off_v + (int)lVar6));
    lVar6 = lVar6 + 1;
    *pSVar5 = dVar1 - dVar2;
  }
  return;
}

Assistant:

virtual void IntStateGetIncrement(const unsigned int off_x,  ///< offset in x state vector
                                      const ChState& x_new,      ///< state vector, final position part
                                      const ChState& x,          ///< state vector, initial position part
                                      const unsigned int off_v,  ///< offset in v state vector
                                      ChStateDelta& Dv           ///< state vector, increment. Here gets the result
    ) {
        for (int i = 0; i < GetDOF(); ++i) {
            Dv(off_v + i) = x_new(off_x + i) - x(off_x + i);
        }
    }